

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.c
# Opt level: O2

wchar_t project_path(chunk *c,loc *gp,wchar_t range,loc grid1,loc grid2,wchar_t flg)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  _Bool _Var4;
  loc grid2_00;
  loc lVar5;
  loc_conflict lVar6;
  square *psVar7;
  int iVar8;
  int iVar9;
  short sVar10;
  uint uVar11;
  int iVar13;
  wchar_t x;
  int iVar14;
  ulong uVar15;
  wchar_t y;
  int iVar16;
  wchar_t wVar17;
  long lVar18;
  uint uVar19;
  int local_98;
  wchar_t wVar12;
  wchar_t wVar20;
  
  grid2_00 = cave_find_decoy((chunk_conflict *)c);
  _Var4 = loc_eq((loc_conflict)grid1,(loc_conflict)grid2);
  wVar17 = L'\0';
  if (!_Var4) {
    uVar15 = (ulong)grid1 >> 0x20;
    y = grid1.y;
    wVar20 = grid2.y;
    uVar19 = wVar20 - y;
    iVar9 = (uint)(y <= wVar20) * 2 + -1;
    uVar2 = -uVar19;
    if (0 < (int)uVar19) {
      uVar2 = uVar19;
    }
    wVar12 = grid2.x;
    x = grid1.x;
    uVar11 = wVar12 - x;
    iVar8 = (uint)(x <= wVar12) * 2 + -1;
    uVar3 = -uVar11;
    if (0 < (int)uVar11) {
      uVar3 = uVar11;
    }
    iVar14 = uVar2 * uVar3;
    sVar10 = (short)flg;
    if (uVar3 < uVar2) {
      iVar13 = uVar11 * uVar11;
      iVar1 = iVar13 * 2;
      local_98 = 0;
      wVar17 = L'\x01';
      uVar15 = (ulong)grid1 & 0xffffffff;
      while( true ) {
        y = iVar9 + y;
        iVar16 = (int)uVar15;
        lVar5 = (loc)loc(iVar16,y);
        *gp = lVar5;
        if (range <= (local_98 >> 1) + wVar17) break;
        if ((flg & 4U) == 0) {
          lVar6 = loc(iVar16,y);
          _Var4 = loc_eq(lVar6,(loc_conflict)grid2);
          if (_Var4) {
            return wVar17;
          }
        }
        if (-1 < sVar10) {
          lVar5 = (loc)loc(iVar16,y);
          if (((uint)flg >> 0xc & 1) == 0) {
            _Var4 = square_isprojectable((chunk_conflict *)c,lVar5);
            if (!_Var4) {
              return wVar17;
            }
          }
          else {
            _Var4 = square_isbelievedwall((chunk_conflict *)c,lVar5);
            if (_Var4) {
              return wVar17;
            }
          }
        }
        if ((flg & 8U) != 0) {
          lVar5 = (loc)loc(iVar16,y);
          psVar7 = square((chunk_conflict *)c,lVar5);
          if (psVar7->mon != 0) {
            return wVar17;
          }
          lVar6 = loc(iVar16,y);
          _Var4 = loc_eq(lVar6,(loc_conflict)grid2_00);
          if (_Var4) {
            return wVar17;
          }
        }
        if ((wVar12 != x) && (iVar13 = iVar13 + iVar1, iVar14 <= iVar13)) {
          uVar15 = (ulong)(uint)(iVar16 + iVar8);
          iVar13 = iVar13 + iVar14 * -2;
          local_98 = local_98 + 1;
        }
        gp = gp + 1;
        wVar17 = wVar17 + L'\x01';
      }
    }
    else if (uVar2 < uVar3) {
      iVar13 = uVar19 * uVar19;
      iVar1 = iVar13 * 2;
      local_98 = 0;
      wVar17 = L'\x01';
      while( true ) {
        x = iVar8 + x;
        iVar16 = (int)uVar15;
        lVar5 = (loc)loc(x,iVar16);
        *gp = lVar5;
        if (range <= (local_98 >> 1) + wVar17) break;
        if ((flg & 4U) == 0) {
          lVar6 = loc(x,iVar16);
          _Var4 = loc_eq(lVar6,(loc_conflict)grid2);
          if (_Var4) {
            return wVar17;
          }
        }
        if (-1 < sVar10) {
          lVar5 = (loc)loc(x,iVar16);
          if (((uint)flg >> 0xc & 1) == 0) {
            _Var4 = square_isprojectable((chunk_conflict *)c,lVar5);
            if (!_Var4) {
              return wVar17;
            }
          }
          else {
            _Var4 = square_isbelievedwall((chunk_conflict *)c,lVar5);
            if (_Var4) {
              return wVar17;
            }
          }
        }
        if ((flg & 8U) != 0) {
          lVar5 = (loc)loc(x,iVar16);
          psVar7 = square((chunk_conflict *)c,lVar5);
          if (psVar7->mon != 0) {
            return wVar17;
          }
          lVar6 = loc(x,iVar16);
          _Var4 = loc_eq(lVar6,(loc_conflict)grid2_00);
          if (_Var4) {
            return wVar17;
          }
        }
        if ((wVar20 != y) && (iVar13 = iVar13 + iVar1, iVar14 <= iVar13)) {
          uVar15 = (ulong)(uint)(iVar16 + iVar9);
          iVar13 = iVar13 + iVar14 * -2;
          local_98 = local_98 + 1;
        }
        gp = gp + 1;
        wVar17 = wVar17 + L'\x01';
      }
    }
    else {
      uVar15 = 1;
      lVar18 = 0;
      while( true ) {
        x = iVar8 + x;
        y = iVar9 + y;
        lVar5 = (loc)loc(x,y);
        gp[lVar18] = lVar5;
        if (range <= (int)(uVar15 >> 1) + (int)lVar18 + L'\x01') break;
        if ((flg & 4U) == 0) {
          lVar6 = loc(x,y);
          _Var4 = loc_eq(lVar6,(loc_conflict)grid2);
          if (_Var4) break;
        }
        if (-1 < sVar10) {
          lVar5 = (loc)loc(x,y);
          if (((uint)flg >> 0xc & 1) == 0) {
            _Var4 = square_isprojectable((chunk_conflict *)c,lVar5);
            if (!_Var4) break;
          }
          else {
            _Var4 = square_isbelievedwall((chunk_conflict *)c,lVar5);
            if (_Var4) break;
          }
        }
        if ((flg & 8U) != 0) {
          lVar5 = (loc)loc(x,y);
          psVar7 = square((chunk_conflict *)c,lVar5);
          if (psVar7->mon != 0) break;
          lVar6 = loc(x,y);
          _Var4 = loc_eq(lVar6,(loc_conflict)grid2_00);
          if (_Var4) break;
        }
        uVar15 = (ulong)((int)uVar15 + 1);
        lVar18 = lVar18 + 1;
      }
      wVar17 = (int)lVar18 + L'\x01';
    }
  }
  return wVar17;
}

Assistant:

int project_path(struct chunk *c, struct loc *gp, int range, struct loc grid1,
				 struct loc grid2, int flg)
{
	int y, x;

	int n = 0;
	int k = 0;

	/* Absolute */
	int ay, ax;

	/* Offsets */
	int sy, sx;

	/* Fractions */
	int frac;

	/* Scale factors */
	int full, half;

	/* Slope */
	int m;

	/* Possible decoy */
	struct loc decoy = cave_find_decoy(c);

	/* No path necessary (or allowed) */
	if (loc_eq(grid1, grid2)) return (0);


	/* Analyze "dy" */
	if (grid2.y < grid1.y) {
		ay = (grid1.y - grid2.y);
		sy = -1;
	} else {
		ay = (grid2.y - grid1.y);
		sy = 1;
	}

	/* Analyze "dx" */
	if (grid2.x < grid1.x) {
		ax = (grid1.x - grid2.x);
		sx = -1;
	} else {
		ax = (grid2.x - grid1.x);
		sx = 1;
	}


	/* Number of "units" in one "half" grid */
	half = (ay * ax);

	/* Number of "units" in one "full" grid */
	full = half << 1;


	/* Vertical */
	if (ay > ax) {
		/* Start at tile edge */
		frac = ax * ax;

		/* Let m = ((dx/dy) * full) = (dx * dx * 2) = (frac * 2) */
		m = frac << 1;

		/* Start */
		y = grid1.y + sy;
		x = grid1.x;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (k >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Slant */
			if (m) {
				/* Advance (X) part 1 */
				frac += m;

				/* Horizontal change */
				if (frac >= half) {
					/* Advance (X) part 2 */
					x += sx;

					/* Advance (X) part 3 */
					frac -= full;

					/* Track distance */
					k++;
				}
			}

			/* Advance (Y) */
			y += sy;
		}
	}

	/* Horizontal */
	else if (ax > ay) {
		/* Start at tile edge */
		frac = ay * ay;

		/* Let m = ((dy/dx) * full) = (dy * dy * 2) = (frac * 2) */
		m = frac << 1;

		/* Start */
		y = grid1.y;
		x = grid1.x + sx;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (k >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Slant */
			if (m) {
				/* Advance (Y) part 1 */
				frac += m;

				/* Vertical change */
				if (frac >= half) {
					/* Advance (Y) part 2 */
					y += sy;

					/* Advance (Y) part 3 */
					frac -= full;

					/* Track distance */
					k++;
				}
			}

			/* Advance (X) */
			x += sx;
		}
	}

	/* Diagonal */
	else {
		/* Start */
		y = grid1.y + sy;
		x = grid1.x + sx;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (n >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Advance */
			y += sy;
			x += sx;
		}
	}

	/* Length */
	return (n);
}